

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_LDRD_rr(DisasContext_conflict1 *s,arg_ldst_rr *a)

{
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 a32;
  TCGv_i32 pTVar2;
  ARMMMUIdx index;
  
  uVar1 = s->features;
  if ((short)uVar1 < 0) {
    if ((a->rt & 1) == 0) {
      tcg_ctx = s->uc->tcg_ctx;
      index = s->mmu_idx & 0xf;
      a32 = op_addr_rr_pre(s,a);
      pTVar2 = tcg_temp_new_i32(tcg_ctx);
      gen_aa32_ld_i32(s,pTVar2,a32,index,s->be_data | MO_32);
      store_reg(s,a->rt,pTVar2);
      tcg_gen_addi_i32_aarch64(tcg_ctx,a32,a32,4);
      pTVar2 = tcg_temp_new_i32(tcg_ctx);
      gen_aa32_ld_i32(s,pTVar2,a32,index,s->be_data | MO_32);
      store_reg(s,a->rt + 1,pTVar2);
      op_addr_rr_post(s,a,a32,-4);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return SUB81((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_LDRD_rr(DisasContext *s, arg_ldst_rr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_idx = get_mem_index(s);
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_5TE) {
        return false;
    }
    if (a->rt & 1) {
        unallocated_encoding(s);
        return true;
    }
    addr = op_addr_rr_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, a->rt, tmp);

    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, a->rt + 1, tmp);

    /* LDRD w/ base writeback is undefined if the registers overlap.  */
    op_addr_rr_post(s, a, addr, -4);
    return true;
}